

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

PyObject * pybind11::str::raw_str(PyObject *op)

{
  PyObject *pPVar1;
  PyObject *str_value;
  PyObject *op_local;
  
  pPVar1 = (PyObject *)PyObject_Str(op);
  return pPVar1;
}

Assistant:

static PyObject *raw_str(PyObject *op) {
        PyObject *str_value = PyObject_Str(op);
#if PY_MAJOR_VERSION < 3
        if (!str_value) throw error_already_set();
        PyObject *unicode = PyUnicode_FromEncodedObject(str_value, "utf-8", nullptr);
        Py_XDECREF(str_value); str_value = unicode;
#endif
        return str_value;
    }